

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O2

void __thiscall libtorrent::bt_peer_connection::write_bitfield(bt_peer_connection *this)

{
  byte *pbVar1;
  pointer psVar2;
  _Head_base<0UL,_libtorrent::piece_picker_*,_false> this_00;
  counters *this_01;
  ulong uVar3;
  undefined8 uVar4;
  int64_t value;
  long lVar5;
  undefined1 auVar6 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  bool bVar8;
  byte bVar9;
  int iVar10;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *ptVar11;
  uint uVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  size_t k;
  pointer psVar14;
  char *pcVar15;
  size_t __n;
  piece_index_t pVar16;
  span<const_char> buf;
  undefined8 uStack_90;
  undefined1 auStack_88 [8];
  undefined1 local_80 [8];
  string bitfield_string;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  char *ptr;
  undefined1 local_48 [8];
  shared_ptr<libtorrent::torrent> t;
  
  uStack_90 = 0x1fe71c;
  std::__weak_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
            ((__weak_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2> *)local_80,
             &(this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
              super___weak_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>);
  uStack_90 = 0x1fe72b;
  std::__shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2> *)local_48,
             (__weak_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2> *)local_80);
  uStack_90 = 0x1fe734;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&bitfield_string);
  t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  if ((*(undefined1 *)((long)local_48 + 0x5b0) & 8) == 0) {
    if (((this->super_peer_connection).field_0x765 & 4) != 0) {
      uStack_90 = 0x1fe8d2;
      bVar8 = torrent::is_seed((torrent *)local_48);
      if (bVar8) {
        uStack_90 = 0x1fe8e3;
        write_have_all((bt_peer_connection *)
                       t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
        p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_88;
        goto LAB_001fea5c;
      }
      if (((ulong)t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi[0x76]._vptr__Sp_counted_base & 0x40000000000) != 0) {
        uStack_90 = 0x1fe994;
        iVar10 = torrent::num_have((torrent *)local_48);
        if (iVar10 == 0) {
          uStack_90 = 0x1fea7d;
          write_have_none((bt_peer_connection *)
                          t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi);
          p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_88;
          goto LAB_001fea5c;
        }
      }
    }
    uStack_90 = 0x1fe75a;
    iVar10 = torrent::num_have((torrent *)local_48);
    _Var7 = t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    if (iVar10 == 0) {
      uStack_90 = 0x1fe96e;
      peer_connection::peer_log
                ((peer_connection *)
                 t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi,info,"BITFIELD","not sending bitfield, have none");
      pbVar1 = (byte *)((long)&_Var7._M_pi[0x76]._vptr__Sp_counted_base + 5);
      *pbVar1 = *pbVar1 | 8;
      p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_88;
    }
    else {
      iVar10 = (((((torrent_hot_members *)((long)local_48 + 8))->m_torrent_file).
                 super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_files).m_num_pieces;
      ptr = (char *)(long)iVar10;
      uStack_90 = 8;
      uVar3 = (long)(iVar10 + 7) / 8;
      iVar10 = (int)uVar3;
      __n = (size_t)iVar10;
      lVar5 = -(__n + 0x14 & 0xfffffffffffffff0);
      p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(auStack_88 + lVar5);
      local_58._M_pi = p_Var13;
      *(undefined8 *)(auStack_88 + lVar5 + -8) = 0x1fe7a5;
      detail::write_impl<int,int,char*>(iVar10 + 1,(char **)&local_58);
      *(char *)&(local_58._M_pi)->_vptr__Sp_counted_base = '\x05';
      auVar6 = local_48;
      local_58._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(local_58._M_pi)->_vptr__Sp_counted_base + 1);
      *(undefined8 *)(auStack_88 + lVar5 + -8) = 0x1fe7b9;
      bVar8 = torrent::is_seed((torrent *)auVar6);
      _Var7._M_pi = local_58._M_pi;
      bitfield_string.field_2._8_8_ = __n + 5;
      if (bVar8) {
        local_80[0] = 0xff;
        *(undefined8 *)(auStack_88 + lVar5 + -8) = 0x1fe7dc;
        std::__fill_n_a<char*,int,unsigned_char>(_Var7._M_pi,uVar3 & 0xffffffff);
        auStack_88[bitfield_string.field_2._8_8_ + lVar5 + -1] = (char)(0xff << (-(char)ptr & 7U));
      }
      else {
        pVar16.m_val = 0;
        *(undefined8 *)(auStack_88 + lVar5 + -8) = 0x1fe9b2;
        memset(_Var7._M_pi,0,__n);
        this_00._M_head_impl =
             (((torrent_hot_members *)((long)local_48 + 8))->m_picker)._M_t.
             super___uniq_ptr_impl<libtorrent::piece_picker,_std::default_delete<libtorrent::piece_picker>_>
             ._M_t.
             super__Tuple_impl<0UL,_libtorrent::piece_picker_*,_std::default_delete<libtorrent::piece_picker>_>
             .super__Head_base<0UL,_libtorrent::piece_picker_*,_false>._M_head_impl;
        iVar10 = 0;
        if (0 < (int)ptr) {
          iVar10 = (int)ptr;
        }
        uVar12 = 0x80;
        for (; iVar10 != pVar16.m_val; pVar16.m_val = pVar16.m_val + 1) {
          *(undefined8 *)(auStack_88 + lVar5 + -8) = 0x1fe9e3;
          bVar8 = piece_picker::have_piece(this_00._M_head_impl,pVar16);
          if (bVar8) {
            *(byte *)&(local_58._M_pi)->_vptr__Sp_counted_base =
                 *(byte *)&(local_58._M_pi)->_vptr__Sp_counted_base | (byte)uVar12;
          }
          if (uVar12 < 2) {
            local_58._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(local_58._M_pi)->_vptr__Sp_counted_base + 1);
            uVar12 = 0x80;
          }
          else {
            uVar12 = (int)uVar12 >> 1;
          }
        }
      }
      psVar2 = (((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                  *)((long)local_48 + 0x3f0))->
               super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (psVar14 = (((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                        *)((long)local_48 + 0x3f0))->
                     super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; psVar14 != psVar2;
          psVar14 = psVar14 + 1) {
        iVar10 = psVar14->m_val;
        *(undefined8 *)(auStack_88 + lVar5 + -8) = 8;
        auStack_88[iVar10 / (int)*(undefined8 *)(auStack_88 + lVar5 + -8) + lVar5 + 5] =
             auStack_88[iVar10 / (int)*(undefined8 *)(auStack_88 + lVar5 + -8) + lVar5 + 5] |
             (byte)(0x80 >> ((byte)iVar10 & 7));
      }
      *(undefined8 *)(auStack_88 + lVar5 + -8) = 1;
      _Var7 = t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      uVar4 = *(undefined8 *)(auStack_88 + lVar5 + -8);
      *(undefined8 *)(auStack_88 + lVar5 + -8) = 0x1fe8f4;
      bVar8 = peer_connection::should_log((peer_connection *)_Var7._M_pi,(direction_t)uVar4);
      if (bVar8) {
        local_80 = (undefined1  [8])&bitfield_string._M_string_length;
        bitfield_string._M_dataplus._M_p = (pointer)0x0;
        bitfield_string._M_string_length._0_1_ = 0;
        *(undefined8 *)(auStack_88 + lVar5 + -8) = 0x1fe919;
        std::__cxx11::string::resize((ulong)local_80);
        for (pcVar15 = (char *)0x0; auVar6 = local_80, ptr != pcVar15; pcVar15 = pcVar15 + 1) {
          *(undefined8 *)(auStack_88 + lVar5 + -8) = 8;
          pcVar15[(long)((peer_class_set *)((long)local_80 + 0x50) + -2) + 0x30] =
               (byte)~(auStack_88
                       [(int)((long)((ulong)(uint)((int)pcVar15 >> 0x1f) << 0x20 |
                                    (ulong)pcVar15 & 0xffffffff) /
                             (long)(int)*(undefined8 *)(auStack_88 + lVar5 + -8)) + lVar5 + 5] <<
                      ((byte)pcVar15 & 7)) >> 7 ^ 0x31;
        }
        *(undefined8 *)(auStack_88 + lVar5 + -8) = 1;
        _Var7 = t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        uVar4 = *(undefined8 *)(auStack_88 + lVar5 + -8);
        *(undefined8 *)(auStack_88 + lVar5 + -8) = 0x1fea27;
        peer_connection::peer_log
                  ((peer_connection *)_Var7._M_pi,(direction_t)uVar4,"BITFIELD","%s",auVar6);
        *(undefined8 *)(auStack_88 + lVar5 + -8) = 0x1fea2f;
        std::__cxx11::string::~string((string *)local_80);
      }
      _Var7._M_pi = t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      uVar4 = bitfield_string.field_2._8_8_;
      pbVar1 = (byte *)((long)&t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi[0x76]._vptr__Sp_counted_base + 5);
      *pbVar1 = *pbVar1 | 8;
      *(undefined8 *)(auStack_88 + lVar5 + -8) = 0x1fea46;
      buf.m_len = uVar4;
      buf.m_ptr = (char *)p_Var13;
      peer_connection::send_buffer((peer_connection *)_Var7._M_pi,buf);
      this_01 = *(counters **)
                 &t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi[0xe]._M_use_count;
      *(undefined8 *)(auStack_88 + lVar5 + -8) = 0x5b;
      uVar4 = *(undefined8 *)(auStack_88 + lVar5 + -8);
      *(undefined8 *)(auStack_88 + lVar5 + -8) = 1;
      value = *(int64_t *)(auStack_88 + lVar5 + -8);
      *(undefined8 *)(auStack_88 + lVar5 + -8) = 0x1fea5c;
      counters::inc_stats_counter(this_01,(int)uVar4,value);
    }
  }
  else {
    uStack_90 = 0x1fe850;
    peer_connection::peer_log
              (&this->super_peer_connection,info,"BITFIELD","not sending bitfield, super seeding");
    bVar9 = (this->super_peer_connection).field_0x765;
    if ((bVar9 & 4) != 0) {
      uStack_90 = 0x1fe862;
      write_have_none(this);
      bVar9 = *(byte *)((long)&t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi[0x76]._vptr__Sp_counted_base + 5);
      this = (bt_peer_connection *)
             t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    }
    auVar6 = local_48;
    (this->super_peer_connection).field_0x765 = bVar9 | 8;
    uStack_90 = 0x1fe87d;
    ptVar11 = peer_connection::get_bitfield(&this->super_peer_connection);
    uStack_90 = 0x1fe888;
    pVar16 = torrent::get_piece_to_super_seed((torrent *)auVar6,ptVar11);
    if (-1 < pVar16.m_val) {
      uStack_90 = 0x1fe89a;
      peer_connection::superseed_piece
                ((peer_connection *)
                 t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi,(piece_index_t)0xffffffff,pVar16);
    }
    uStack_90 = 0x1fe8a7;
    ptVar11 = peer_connection::get_bitfield
                        ((peer_connection *)
                         t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
    uStack_90 = 0x1fe8b2;
    pVar16 = torrent::get_piece_to_super_seed((torrent *)local_48,ptVar11);
    p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_88;
    if (-1 < pVar16.m_val) {
      uStack_90 = 0x1fe8c8;
      peer_connection::superseed_piece
                ((peer_connection *)
                 t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi,(piece_index_t)0xffffffff,pVar16);
      p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_88;
    }
  }
LAB_001fea5c:
  p_Var13[-1]._M_use_count = 0x1fea65;
  p_Var13[-1]._M_weak_count = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&t);
  return;
}

Assistant:

void bt_peer_connection::write_bitfield()
	{
		INVARIANT_CHECK;

		// if we have not received the other peer's extension bits yet, how do we
		// know whether to send a have-all or have-none?
		TORRENT_ASSERT(m_state >= state_t::read_peer_id);

		std::shared_ptr<torrent> t = associated_torrent().lock();
		TORRENT_ASSERT(t);
		TORRENT_ASSERT(m_sent_handshake);
		TORRENT_ASSERT(t->valid_metadata());

#ifndef TORRENT_DISABLE_SUPERSEEDING
		if (t->super_seeding())
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "BITFIELD", "not sending bitfield, super seeding");
#endif
			if (m_supports_fast) write_have_none();

			// if we are super seeding, pretend to not have any piece
			// and don't send a bitfield
			m_sent_bitfield = true;

			// bootstrap super-seeding by sending two have message
			piece_index_t piece = t->get_piece_to_super_seed(get_bitfield());
			if (piece >= piece_index_t(0)) superseed_piece(piece_index_t(-1), piece);
			piece = t->get_piece_to_super_seed(get_bitfield());
			if (piece >= piece_index_t(0)) superseed_piece(piece_index_t(-1), piece);
			return;
		}
		else
#endif
			if (m_supports_fast && t->is_seed())
		{
			write_have_all();
			return;
		}
		else if (m_supports_fast && t->num_have() == 0)
		{
			write_have_none();
			return;
		}
		else if (t->num_have() == 0)
		{
			// don't send a bitfield if we don't have any pieces
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "BITFIELD", "not sending bitfield, have none");
#endif
			m_sent_bitfield = true;
			return;
		}

		const int num_pieces = t->torrent_file().num_pieces();
		TORRENT_ASSERT(num_pieces > 0);

		constexpr std::uint8_t char_bit_mask = CHAR_BIT - 1;
		constexpr std::uint8_t char_top_bit = 1 << (CHAR_BIT - 1);

		const int packet_size = (num_pieces + char_bit_mask) / CHAR_BIT + 5;

		TORRENT_ALLOCA(msg, char, packet_size);
		if (msg.data() == nullptr) return; // out of memory
		auto ptr = msg.begin();

		detail::write_int32(packet_size - 4, ptr);
		detail::write_uint8(msg_bitfield, ptr);

		if (t->is_seed())
		{
			std::fill_n(ptr, packet_size - 5, std::uint8_t{0xff});

			// Clear trailing bits
			msg.back() = static_cast<char>((0xff << ((CHAR_BIT - (num_pieces & char_bit_mask)) & char_bit_mask)) & 0xff);
		}
		else
		{
			std::memset(ptr, 0, aux::numeric_cast<std::size_t>(packet_size - 5));
			piece_picker const& p = t->picker();
			int mask = char_top_bit;
			for (piece_index_t i(0); i < piece_index_t(num_pieces); ++i)
			{
				if (p.have_piece(i)) *ptr |= mask;
				mask >>= 1;
				if (mask == 0)
				{
					mask = char_top_bit;
					++ptr;
				}
			}
		}

#ifndef TORRENT_DISABLE_PREDICTIVE_PIECES
		// add predictive pieces to the bitfield as well, since we won't
		// announce them again
		for (piece_index_t const p : t->predictive_pieces())
			msg[5 + static_cast<int>(p) / CHAR_BIT] |= (char_top_bit >> (static_cast<int>(p) & char_bit_mask));
#endif

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::outgoing_message))
		{
			std::string bitfield_string;
			std::size_t const n_pieces = aux::numeric_cast<std::size_t>(num_pieces);
			bitfield_string.resize(n_pieces);
			for (std::size_t k = 0; k < n_pieces; ++k)
			{
				if (msg[5 + int(k) / CHAR_BIT] & (char_top_bit >> (k % CHAR_BIT))) bitfield_string[k] = '1';
				else bitfield_string[k] = '0';
			}
			peer_log(peer_log_alert::outgoing_message, "BITFIELD"
				, "%s", bitfield_string.c_str());
		}
#endif
		m_sent_bitfield = true;

		send_buffer(msg);

		stats_counters().inc_stats_counter(counters::num_outgoing_bitfield);
	}